

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
Page::move_once(Page *this,Direction *direction_1,Direction *direction_2,bool *end_game)

{
  pointer *pppSVar1;
  pointer ppSVar2;
  bool bVar3;
  Direction direction;
  int iVar4;
  pointer ppSVar5;
  Direction *pDVar6;
  long lVar7;
  undefined8 *__dest;
  long lVar8;
  pointer __src;
  Snake *pSVar9;
  ulong uVar10;
  long lVar11;
  long *local_50 [2];
  long local_40 [2];
  
  ppSVar5 = (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar5) {
    lVar8 = -8;
    lVar11 = 0;
    uVar10 = 0;
    do {
      pSVar9 = *(Snake **)((long)ppSVar5 + lVar11);
      if (pSVar9->bot == true) {
        direction = determine_direction_move_bot(this,pSVar9);
      }
      else {
        lVar7 = *(long *)(*(long *)((long)ppSVar5 + lVar11) + 0x28);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,lVar7,
                   *(long *)(*(long *)((long)ppSVar5 + lVar11) + 0x30) + lVar7);
        iVar4 = std::__cxx11::string::compare((char *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pSVar9 = *(Snake **)
                  ((long)(this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar11);
        pDVar6 = direction_1;
        if (iVar4 != 0) {
          pDVar6 = direction_2;
        }
        direction = *pDVar6;
      }
      Snake::move(pSVar9,direction);
      handle_crash_wall(this,*(Snake **)
                              ((long)(this->snakes).
                                     super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar11));
      handle_eat_food(this,*(Snake **)
                            ((long)(this->snakes).
                                   super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar11));
      ppSVar5 = (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar9 = *(Snake **)((long)ppSVar5 + lVar11);
      bVar3 = Snake::check_crash_to_self_body(pSVar9);
      if (bVar3) {
        __src = (pointer)((long)ppSVar5 + lVar11 + 8);
        ppSVar2 = (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (__src != ppSVar2) {
          lVar7 = (long)ppSVar2 - (long)ppSVar5;
          __dest = (undefined8 *)((long)ppSVar5 + lVar11);
LAB_00103bf0:
          memmove(__dest,__src,lVar7 + lVar8);
        }
LAB_00103bf5:
        pppSVar1 = &(this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + -1;
      }
      else {
        bVar3 = check_crash_to_another_snakes_body(this,pSVar9);
        ppSVar5 = (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __dest = (undefined8 *)((long)ppSVar5 + lVar11);
        if (bVar3) {
          __src = (pointer)((long)ppSVar5 + lVar11 + 8);
          ppSVar2 = (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (__src != ppSVar2) {
            lVar7 = (long)ppSVar2 - (long)ppSVar5;
            goto LAB_00103bf0;
          }
          goto LAB_00103bf5;
        }
        check_and_handle_crash_to_another_snakes_head(this,(Snake *)*__dest);
      }
      uVar10 = uVar10 + 1;
      ppSVar5 = (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 8;
      lVar8 = lVar8 + -8;
    } while (uVar10 < (ulong)((long)(this->snakes).
                                    super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppSVar5 >> 3));
  }
  check_end_game(this,end_game);
  return;
}

Assistant:

void Page::move_once(Direction& direction_1, Direction& direction_2, bool &end_game)
{
	for(int i = 0; i < snakes.size(); i++)
	{
		if(snakes[i]->is_bot())
		{
			snakes[i]->move(determine_direction_move_bot(snakes[i]));
		}
		else
		{
			if(snakes[i]->get_name() == "PLAYER 1")
				snakes[i]->move(direction_1);

			else					
				snakes[i]->move(direction_2);
		}
		
		handle_crash_wall(snakes[i]);
		handle_eat_food(snakes[i]);

		if(snakes[i]->check_crash_to_self_body())
		{
			snakes.erase(snakes.begin() + i);
			continue;
		}
				
		if(check_crash_to_another_snakes_body(snakes[i]))
		{
			snakes.erase(snakes.begin() + i);
			continue;
		}

		check_and_handle_crash_to_another_snakes_head(snakes[i]);
	}

	check_end_game(end_game);
}